

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

SQInteger __thiscall
SQVM::FallBackSet(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  bool bVar3;
  uint uVar4;
  AutoDec local_78;
  AutoDec ad;
  SQObjectPtr t;
  SQObjectPtr closure;
  SQObjectPtr local_40;
  SQObjectPtr *local_30;
  SQObjectPtr *val_local;
  SQObjectPtr *key_local;
  SQObjectPtr *self_local;
  SQVM *this_local;
  
  SVar1 = (self->super_SQObject)._type;
  local_30 = val;
  val_local = key;
  key_local = self;
  self_local = (SQObjectPtr *)this;
  if (SVar1 == OT_TABLE) {
    if ((((self->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0) {
      ::SQObjectPtr::SQObjectPtr(&local_40,((self->super_SQObject)._unVal.pDelegable)->_delegate);
      bVar3 = Set(this,&local_40,val_local,local_30,0x29a);
      ::SQObjectPtr::~SQObjectPtr(&local_40);
      if (bVar3) {
        return (SQInteger)(SQVM *)0x0;
      }
    }
  }
  else if ((SVar1 != OT_USERDATA) && (SVar1 != OT_INSTANCE)) {
    return (SQInteger)(SQVM *)0x1;
  }
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&t.super_SQObject._unVal);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&ad);
  pSVar2 = (key_local->super_SQObject)._unVal.pTable;
  uVar4 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[6]
          )(pSVar2,this,6,&t.super_SQObject._unVal);
  if ((uVar4 & 1) != 0) {
    Push(this,key_local);
    Push(this,val_local);
    Push(this,local_30);
    this->_nmetamethodscall = this->_nmetamethodscall + 1;
    AutoDec::AutoDec(&local_78,&this->_nmetamethodscall);
    bVar3 = Call(this,(SQObjectPtr *)&t.super_SQObject._unVal,3,this->_top + -3,(SQObjectPtr *)&ad,0
                );
    if (bVar3) {
      Pop(this,3);
      this_local = (SQVM *)0x0;
      bVar3 = true;
    }
    else {
      Pop(this,3);
      if ((this->_lasterror).super_SQObject._type == OT_NULL) {
        bVar3 = false;
      }
      else {
        this_local = (SQVM *)0x2;
        bVar3 = true;
      }
    }
    AutoDec::~AutoDec(&local_78);
    if (bVar3) goto LAB_00140da0;
  }
  bVar3 = false;
LAB_00140da0:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&ad);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&t.super_SQObject._unVal);
  if (!bVar3) {
    return (SQInteger)(SQVM *)0x1;
  }
  return (SQInteger)this_local;
}

Assistant:

SQInteger SQVM::FallBackSet(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val)
{
    switch(type(self)) {
    case OT_TABLE:
        if(_table(self)->_delegate) {
            if(Set(_table(self)->_delegate,key,val,DONT_FALL_BACK)) return FALLBACK_OK;
        }
        //keps on going
    case OT_INSTANCE:
    case OT_USERDATA:{
        SQObjectPtr closure;
        SQObjectPtr t;
        if(_delegable(self)->GetMetaMethod(this, MT_SET, closure)) {
            Push(self);Push(key);Push(val);
            _nmetamethodscall++;
            AutoDec ad(&_nmetamethodscall);
            if(Call(closure, 3, _top - 3, t, SQFalse)) {
                Pop(3);
                return FALLBACK_OK;
            }
            else {
                Pop(3);
                if(type(_lasterror) != OT_NULL) { //NULL means "clean failure" (not found)
                    return FALLBACK_ERROR;
                }
            }
        }
                     }
        break;
        default: break;//shutup GCC 4.x
    }
    // no metamethod or no fallback type
    return FALLBACK_NO_MATCH;
}